

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeModifyAssignment(ExpressionContext *ctx,SynModifyAssignment *syntax)

{
  SynBase *source;
  FunctionLookupChain chain;
  FunctionLookupChain chain_00;
  bool bVar1;
  SynBinaryOpType SVar2;
  ExprVariableAccess *value1;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSVar3;
  char *strBegin;
  ExprVariableAccess *pEVar4;
  TypeRef *pTVar5;
  VariableHandle *pVVar6;
  ExprFunctionCall *pEVar7;
  ExprFunctionAccess *pEVar8;
  ExprError *pEVar9;
  bool_type bVar10;
  TypeBase *pTVar11;
  VariableData *variable;
  ExprBase *pEVar12;
  ExprVariableDefinition *this;
  ExprDereference *pEVar13;
  ExprBase *value;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ExprBase *result;
  ExprBase *lhsValue;
  ExprBase *definition;
  ExprBase *assignment;
  VariableData *storage;
  TypeRef *typeRef;
  undefined4 local_1b8;
  ExpressionContext *local_1b0;
  ExprBase *call_1;
  Node *pNStack_1a0;
  Node *local_198;
  ExprBase *local_190;
  ExprBase *overloads_1;
  FunctionLookupChain function_1;
  FunctionData *proto;
  undefined1 local_160 [12];
  ExpressionContext *local_150;
  ExprBase *call;
  Node *pNStack_140;
  Node *local_138;
  ExprBase *local_130;
  ExprBase *overloads;
  FunctionLookupChain function;
  ArgumentData local_100;
  undefined1 local_d0 [8];
  SmallArray<ArgumentData,_1U> arguments;
  ExprBase *result_2;
  ExprFunctionAccess *access;
  ExprFunctionCall *node_2;
  ExprDereference *node_1;
  ExprVariableAccess *node;
  ExprBase *wrapped;
  ExprBase *local_48;
  ExprBase *result_1;
  TypePair typePair;
  ExprBase *rhs;
  ExprBase *lhs;
  SynModifyAssignment *syntax_local;
  ExpressionContext *ctx_local;
  
  value1 = (ExprVariableAccess *)AnalyzeExpression(ctx,syntax->lhs);
  typePair.b = (TypeBase *)AnalyzeExpression(ctx,syntax->rhs);
  bVar1 = isType<TypeError>((value1->super_ExprBase).type);
  if ((bVar1) || (bVar1 = isType<TypeError>((TypeBase *)((typePair.b)->name).end), bVar1)) {
    pEVar9 = ExpressionContext::get<ExprError>(ctx);
    pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError
              (pEVar9,&syntax->super_SynBase,pTVar11,(ExprBase *)value1,(ExprBase *)typePair.b);
    return &pEVar9->super_ExprBase;
  }
  TypePair::TypePair((TypePair *)&result_1,(value1->super_ExprBase).type,
                     (TypeBase *)((typePair.b)->name).end);
  pSVar3 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::operator[]
                     (&ctx->noModifyOperatorForTypePair,
                      *(int *)&(syntax->super_SynBase).field_0x3c - 1);
  bVar1 = SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains(pSVar3,(TypePair *)&result_1);
  if (!bVar1) {
    strBegin = GetOpName(*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
    InplaceStr::InplaceStr((InplaceStr *)&wrapped,strBegin);
    local_48 = CreateFunctionCall2(ctx,&syntax->super_SynBase,_wrapped,(ExprBase *)value1,
                                   (ExprBase *)typePair.b,true,false,true);
    if (local_48 != (ExprBase *)0x0) {
      return local_48;
    }
    pSVar3 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::operator[]
                       (&ctx->noModifyOperatorForTypePair,
                        *(int *)&(syntax->super_SynBase).field_0x3c - 1);
    SmallDenseSet<TypePair,_TypePairHasher,_4U>::insert(pSVar3,(TypePair *)&result_1);
  }
  pEVar4 = getType<ExprVariableAccess>((ExprBase *)value1);
  if (pEVar4 != (ExprVariableAccess *)0x0) {
    node = (ExprVariableAccess *)ExpressionContext::get<ExprGetAddress>(ctx);
    source = (value1->super_ExprBase).source;
    pTVar5 = ExpressionContext::GetReferenceType(ctx,(value1->super_ExprBase).type);
    pVVar6 = ExpressionContext::get<VariableHandle>(ctx);
    VariableHandle::VariableHandle(pVVar6,(pEVar4->super_ExprBase).source,pEVar4->variable);
    ExprGetAddress::ExprGetAddress((ExprGetAddress *)node,source,&pTVar5->super_TypeBase,pVVar6);
    goto LAB_001c1a64;
  }
  pEVar13 = getType<ExprDereference>((ExprBase *)value1);
  if (pEVar13 != (ExprDereference *)0x0) {
    node = (ExprVariableAccess *)pEVar13->value;
    goto LAB_001c1a64;
  }
  pEVar7 = getType<ExprFunctionCall>((ExprBase *)value1);
  node = value1;
  if ((((pEVar7 == (ExprFunctionCall *)0x0) ||
       (pEVar8 = getType<ExprFunctionAccess>(pEVar7->function), pEVar8 == (ExprFunctionAccess *)0x0)
       ) || (pEVar8->function == (FunctionData *)0x0)) || ((pEVar8->function->accessor & 1U) == 0))
  goto LAB_001c1a64;
  SVar2 = anon_unknown.dwarf_8df1c::GetBinaryOpType
                    (*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
  arguments.allocator =
       (Allocator *)
       CreateBinaryOp(ctx,&syntax->super_SynBase,SVar2,(ExprBase *)value1,(ExprBase *)typePair.b);
  bVar1 = isType<TypeError>(((ExprBase *)arguments.allocator)->type);
  if (bVar1) {
    pEVar9 = ExpressionContext::get<ExprError>(ctx);
    pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError
              (pEVar9,&syntax->super_SynBase,pTVar11,(ExprBase *)value1,(ExprBase *)typePair.b);
    return &pEVar9->super_ExprBase;
  }
  SmallArray<ArgumentData,_1U>::SmallArray((SmallArray<ArgumentData,_1U> *)local_d0,ctx->allocator);
  ArgumentData::ArgumentData
            (&local_100,&syntax->super_SynBase,false,(SynIdentifier *)0x0,
             (TypeBase *)arguments.allocator[3]._vptr_Allocator,(ExprBase *)arguments.allocator);
  SmallArray<ArgumentData,_1U>::push_back((SmallArray<ArgumentData,_1U> *)local_d0,&local_100);
  anon_unknown.dwarf_8df1c::LookupFunctionChainByName
            ((FunctionLookupChain *)&overloads,ctx,pEVar8->function->nameHash);
  bVar10 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                     ((FunctionLookupChain *)&overloads);
  if (bVar10 == 0) {
LAB_001c18ca:
    function_1.scope = (ScopeData *)pEVar8->function->proto;
    if ((FunctionData *)function_1.scope != (FunctionData *)0x0) {
      anon_unknown.dwarf_8df1c::LookupFunctionChainByName
                ((FunctionLookupChain *)&overloads_1,ctx,
                 ((FunctionData *)function_1.scope)->nameHash);
      bVar10 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                         ((FunctionLookupChain *)&overloads_1);
      if (bVar10 != 0) {
        local_198 = function_1.node.node;
        call_1 = overloads_1;
        pNStack_1a0 = function_1.node.start;
        chain_00.node.node._0_4_ = (int)function_1.node.start;
        chain_00.node.start = (Node *)overloads_1;
        chain_00.node.node._4_4_ = (int)((ulong)function_1.node.start >> 0x20);
        chain_00.scope._0_4_ = (int)function_1.node.node;
        chain_00.scope._4_4_ = (int)((ulong)function_1.node.node >> 0x20);
        pEVar12 = CreateFunctionAccess(ctx,&syntax->super_SynBase,chain_00,pEVar8->context);
        local_190 = pEVar12;
        ArrayView<ArgumentData>::ArrayView<1u>
                  ((ArrayView<ArgumentData> *)&typeRef,(SmallArray<ArgumentData,_1U> *)local_d0);
        arguments_01._12_4_ = 0;
        arguments_01.data = (ArgumentData *)typeRef;
        arguments_01.count = local_1b8;
        local_1b0 = (ExpressionContext *)
                    CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar12,arguments_01,true);
        if (local_1b0 != (ExpressionContext *)0x0) {
          bVar1 = true;
          ctx_local = local_1b0;
          goto LAB_001c1a3d;
        }
      }
    }
    bVar1 = false;
  }
  else {
    local_138 = function.node.node;
    call = overloads;
    pNStack_140 = function.node.start;
    chain.node.node._0_4_ = (int)function.node.start;
    chain.node.start = (Node *)overloads;
    chain.node.node._4_4_ = (int)((ulong)function.node.start >> 0x20);
    chain.scope._0_4_ = (int)function.node.node;
    chain.scope._4_4_ = (int)((ulong)function.node.node >> 0x20);
    pEVar12 = CreateFunctionAccess(ctx,&syntax->super_SynBase,chain,pEVar8->context);
    local_130 = pEVar12;
    ArrayView<ArgumentData>::ArrayView<1u>
              ((ArrayView<ArgumentData> *)local_160,(SmallArray<ArgumentData,_1U> *)local_d0);
    arguments_00._12_4_ = 0;
    arguments_00.data = (ArgumentData *)local_160._0_8_;
    arguments_00.count = local_160._8_4_;
    local_150 = (ExpressionContext *)
                CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar12,arguments_00,true);
    if (local_150 == (ExpressionContext *)0x0) goto LAB_001c18ca;
    bVar1 = true;
    ctx_local = local_150;
  }
LAB_001c1a3d:
  SmallArray<ArgumentData,_1U>::~SmallArray((SmallArray<ArgumentData,_1U> *)local_d0);
  if (bVar1) {
    return (ExprBase *)ctx_local;
  }
LAB_001c1a64:
  pTVar5 = getType<TypeRef>((node->super_ExprBase).type);
  if (pTVar5 == (TypeRef *)0x0) {
    anon_unknown.dwarf_8df1c::Report
              (ctx,&syntax->super_SynBase,"ERROR: cannot change immutable value of type %.*s",
               (ulong)(uint)((int)(((value1->super_ExprBase).type)->name).end -
                            (int)(((value1->super_ExprBase).type)->name).begin),
               (((value1->super_ExprBase).type)->name).begin);
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
    pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError
              ((ExprError *)ctx_local,&syntax->super_SynBase,pTVar11,(ExprBase *)value1,
               (ExprBase *)typePair.b);
  }
  else {
    variable = anon_unknown.dwarf_8df1c::AllocateTemporary
                         (ctx,&syntax->super_SynBase,(node->super_ExprBase).type);
    pEVar12 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
    pEVar12 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar12,&node->super_ExprBase);
    this = ExpressionContext::get<ExprVariableDefinition>(ctx);
    pTVar11 = ctx->typeVoid;
    pVVar6 = ExpressionContext::get<VariableHandle>(ctx);
    VariableHandle::VariableHandle(pVVar6,(SynBase *)0x0,variable);
    ExprVariableDefinition::ExprVariableDefinition
              (this,&syntax->super_SynBase,pTVar11,pVVar6,pEVar12);
    pEVar13 = ExpressionContext::get<ExprDereference>(ctx);
    pTVar11 = (value1->super_ExprBase).type;
    pEVar12 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
    ExprDereference::ExprDereference(pEVar13,&syntax->super_SynBase,pTVar11,pEVar12);
    SVar2 = anon_unknown.dwarf_8df1c::GetBinaryOpType
                      (*(SynModifyAssignType *)&(syntax->super_SynBase).field_0x3c);
    pEVar12 = CreateBinaryOp(ctx,&syntax->super_SynBase,SVar2,&pEVar13->super_ExprBase,
                             (ExprBase *)typePair.b);
    bVar1 = isType<TypeError>(pEVar12->type);
    if (bVar1) {
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
      pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ExprError::ExprError
                ((ExprError *)ctx_local,&syntax->super_SynBase,pTVar11,(ExprBase *)value1,
                 (ExprBase *)typePair.b);
    }
    else {
      pEVar13 = ExpressionContext::get<ExprDereference>(ctx);
      pTVar11 = (value1->super_ExprBase).type;
      value = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
      ExprDereference::ExprDereference(pEVar13,&syntax->super_SynBase,pTVar11,value);
      pEVar12 = CreateAssignment(ctx,&syntax->super_SynBase,&pEVar13->super_ExprBase,pEVar12);
      ctx_local = (ExpressionContext *)
                  CreateSequence(ctx,&syntax->super_SynBase,&this->super_ExprBase,pEVar12);
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeModifyAssignment(ExpressionContext &ctx, SynModifyAssignment *syntax)
{
	ExprBase *lhs = AnalyzeExpression(ctx, syntax->lhs);
	ExprBase *rhs = AnalyzeExpression(ctx, syntax->rhs);

	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

	TypePair typePair(lhs->type, rhs->type);

	if(!ctx.noModifyOperatorForTypePair[int(syntax->type) - 1].contains(typePair))
	{
		if(ExprBase *result = CreateFunctionCall2(ctx, syntax, InplaceStr(GetOpName(syntax->type)), lhs, rhs, true, false, true))
			return result;
		else
			ctx.noModifyOperatorForTypePair[int(syntax->type) - 1].insert(typePair);
	}

	// Unwrap modifiable pointer
	ExprBase* wrapped = lhs;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(lhs))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(lhs->source, ctx.GetReferenceType(lhs->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(lhs))
	{
		wrapped = node->value;
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(lhs))
	{
		// Will try to transform 'get' accessor to 'set'
		if(ExprFunctionAccess *access = getType<ExprFunctionAccess>(node->function))
		{
			if(access->function && access->function->accessor)
			{
				ExprBase *result = CreateBinaryOp(ctx, syntax, GetBinaryOpType(syntax->type), lhs, rhs);

				if(isType<TypeError>(result->type))
					return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

				SmallArray<ArgumentData, 1> arguments(ctx.allocator);
				arguments.push_back(ArgumentData(syntax, false, NULL, result->type, result));

				if(FunctionLookupChain function = LookupFunctionChainByName(ctx, access->function->nameHash))
				{
					ExprBase *overloads = CreateFunctionAccess(ctx, syntax, function, access->context);

					if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, arguments, true))
						return call;
				}

				if(FunctionData *proto = access->function->proto)
				{
					if(FunctionLookupChain function = LookupFunctionChainByName(ctx, proto->nameHash))
					{
						ExprBase *overloads = CreateFunctionAccess(ctx, syntax, function, access->context);

						if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, arguments, true))
							return call;
					}
				}
			}
		}
	}

	TypeRef *typeRef = getType<TypeRef>(wrapped->type);

	if(!typeRef)
	{
		Report(ctx, syntax, "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(lhs->type->name));

		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);
	}

	VariableData *storage = AllocateTemporary(ctx, syntax, wrapped->type);

	ExprBase *assignment = CreateAssignment(ctx, syntax, CreateVariableAccess(ctx, syntax, storage, false), wrapped);

	ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

	ExprBase *lhsValue = new (ctx.get<ExprDereference>()) ExprDereference(syntax, lhs->type, CreateVariableAccess(ctx, syntax, storage, false));

	ExprBase *result = CreateBinaryOp(ctx, syntax, GetBinaryOpType(syntax->type), lhsValue, rhs);

	if(isType<TypeError>(result->type))
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), lhs, rhs);

	return CreateSequence(ctx, syntax, definition, CreateAssignment(ctx, syntax, new (ctx.get<ExprDereference>()) ExprDereference(syntax, lhs->type, CreateVariableAccess(ctx, syntax, storage, false)), result));
}